

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall
glu::sl::ShaderParser::ShaderParser
          (ShaderParser *this,Archive *archive,string *filename,ShaderCaseFactory *caseFactroy)

{
  string *psVar1;
  undefined8 uVar2;
  DefaultDeleter<tcu::Resource> local_35 [13];
  ShaderCaseFactory *local_28;
  ShaderCaseFactory *caseFactroy_local;
  string *filename_local;
  Archive *archive_local;
  ShaderParser *this_local;
  
  this->m_archive = archive;
  local_28 = caseFactroy;
  caseFactroy_local = (ShaderCaseFactory *)filename;
  filename_local = (string *)archive;
  archive_local = (Archive *)this;
  std::__cxx11::string::string((string *)&this->m_filename,(string *)filename);
  psVar1 = filename_local;
  this->m_caseFactory = local_28;
  uVar2 = std::__cxx11::string::c_str();
  uVar2 = (**(code **)(*(long *)psVar1 + 0x10))(psVar1,uVar2);
  de::DefaultDeleter<tcu::Resource>::DefaultDeleter(local_35);
  de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::UniquePtr
            (&this->m_resource,uVar2);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_input);
  this->m_curPtr = (char *)0x0;
  this->m_curToken = TOKEN_LAST;
  std::__cxx11::string::string((string *)&this->m_curTokenStr);
  return;
}

Assistant:

ShaderParser::ShaderParser (const tcu::Archive& archive, const string& filename, ShaderCaseFactory* caseFactroy)
	: m_archive			(archive)
	, m_filename		(filename)
	, m_caseFactory		(caseFactroy)
	, m_resource		(archive.getResource(m_filename.c_str()))
	, m_curPtr			(DE_NULL)
	, m_curToken		(TOKEN_LAST)
{
}